

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.h
# Opt level: O2

void __thiscall
fmcalc::fmcalc(fmcalc *this,int maxRunLevel,int allocrule,string *inputpath,bool netvalue,bool debug
              ,bool allocruleOptimizationOff,bool generalOptimization,bool stepped)

{
  std::__cxx11::string::string((string *)this,(string *)inputpath);
  this->netvalue_ = netvalue;
  this->allocrule_ = allocrule;
  this->debug_ = debug;
  this->allocruleOptimizationOff_ = allocruleOptimizationOff;
  this->generalOptimization_ = generalOptimization;
  (this->policy_tc_vec_vec_vec_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->policy_tc_vec_vec_vec_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->policy_tc_vec_vec_vec_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->max_layer_ = 0;
  this->max_agg_id_ = 0;
  (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->isGULStreamType_ = true;
  this->isOldGULStreamType_ = false;
  (this->profile_vec_new_).super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->profile_vec_new_).super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->profile_vec_new_).super__Vector_base<profile_rec_new,_std::allocator<profile_rec_new>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->profile_vec_stepped_).
  super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->profile_vec_stepped_).
  super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->profile_vec_stepped_).
  super__Vector_base<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>,_std::allocator<std::vector<profile_rec_new,_std::allocator<profile_rec_new>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->maxLevel_ = -1;
  this->maxRunLevel_ = 10000;
  this->max_level_ = 0;
  memset(&this->level_to_max_layer_,0,0xac);
  this->stepped_ = stepped;
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)maxRunLevel);
  return;
}

Assistant:

fmcalc(int maxRunLevel, int allocrule,const std::string &inputpath, bool netvalue, bool debug, bool allocruleOptimizationOff,bool generalOptimization, bool stepped):
		inputpath_(inputpath) , netvalue_(netvalue),allocrule_(allocrule), debug_(debug), allocruleOptimizationOff_(allocruleOptimizationOff), generalOptimization_(generalOptimization),
		stepped_(stepped)
		{ init(maxRunLevel); }